

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogException *
duckdb::Catalog::CreateMissingEntryException
          (CatalogException *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          EntryLookupInfo *lookup_info,reference_set_t<SchemaCatalogEntry> *schemas)

{
  CatalogType type_a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  DatabaseManager *this;
  DBConfig *this_00;
  RETURN_TYPE RVar3;
  reference pvVar4;
  reference pvVar5;
  SchemaCatalogEntry *pSVar6;
  long lVar7;
  CatalogType CVar8;
  CatalogType type;
  CatalogType extraout_DL;
  CatalogType extraout_DL_00;
  CatalogType type_00;
  CatalogType type_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  iterator __begin3;
  _Alloc_hider _Var10;
  pointer pSVar11;
  ClientContext *pCVar12;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  undefined1 auVar13 [8];
  ClientContext *pCVar14;
  duckdb *this_03;
  double dVar15;
  string did_you_mean;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suggestions;
  string schema_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  other_types;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
  lookup_result;
  string extension_name;
  vector<duckdb::SimilarCatalogEntry,_true> unseen_entries;
  bool qualify_schema;
  vector<duckdb::SimilarCatalogEntry,_true> entries;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> databases;
  reference_set_t<SchemaCatalogEntry> unseen_schemas;
  allocator local_2e9;
  ClientContext *local_2e8;
  CatalogException *local_2e0;
  string local_2d8;
  undefined1 local_2b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Base_ptr local_298;
  ulong local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  EntryLookupInfo *local_228;
  ClientContext *local_220;
  undefined1 local_218 [32];
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_1f8;
  bool local_1e0 [32];
  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> local_1c0;
  CatalogEntryRetriever *local_1a8;
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  local_1a0;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  undefined8 uVar9;
  
  pCVar14 = retriever->context;
  local_2e0 = __return_storage_ptr__;
  local_228 = lookup_info;
  local_1a8 = retriever;
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1c0,pCVar14,lookup_info,schemas);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this = DatabaseManager::Get(pCVar14);
  DatabaseManager::GetDatabases
            ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)&local_1a0,this,
             pCVar14);
  this_00 = DBConfig::GetConfig(pCVar14);
  RVar3 = DBConfig::GetSetting<duckdb::CatalogErrorMaxSchemasSetting>(this_00,pCVar14);
  local_220 = (ClientContext *)local_1a0._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = extraout_RDX;
  pCVar12 = (ClientContext *)local_1a0._M_impl.super__Vector_impl_data._M_start;
  while ((CVar8 = (CatalogType)uVar9, pCVar12 != local_220 && (local_68._M_element_count < RVar3)))
  {
    AttachedDatabase::GetCatalog
              ((AttachedDatabase *)
               (pCVar12->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal
               .super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_2e8 = pCVar12;
    GetAllSchemas((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)local_2b8,
                  pCVar14);
    paVar1 = local_2b0;
    auVar13 = local_2b8;
    while ((auVar13 != (undefined1  [8])paVar1 && (local_68._M_element_count < RVar3))) {
      local_218._0_8_ = *(undefined8 *)auVar13;
      ::std::__detail::
      _Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&local_68,(value_type *)local_218);
      auVar13 = (undefined1  [8])((long)auVar13 + 8);
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                     *)local_2b8);
    pCVar12 = (ClientContext *)
              &(local_2e8->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
               internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    uVar9 = extraout_RDX_00;
  }
  local_218._0_8_ = local_218 + 0x10;
  local_218._8_8_ = 0;
  local_218[0x10] = '\0';
  type_a = local_228->catalog_type;
  this_03 = (duckdb *)(ulong)type_a;
  pCVar12 = (ClientContext *)local_228->name;
  if ((byte)(type_a - TABLE_FUNCTION_ENTRY) < 4) {
    ExtensionHelper::FindExtensionInFunctionEntries<706ul>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
                *)&local_248,(ExtensionHelper *)pCVar12,(string *)"!__postfix",
               (ExtensionFunctionEntry (*) [706])schemas);
    if (local_248._M_dataplus._M_p != (pointer)local_248._M_string_length) {
      local_268.field_2._M_allocated_capacity = 0;
      local_2b8 = (undefined1  [8])&local_2a8;
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
      local_2e8 = pCVar12;
      local_220 = pCVar14;
      for (_Var10._M_p = local_248._M_dataplus._M_p;
          _Var10._M_p != (pointer)local_248._M_string_length; _Var10._M_p = _Var10._M_p + 0x28) {
        CVar8 = _Var10._M_p[0x20];
        bVar2 = CompareCatalogTypes(type_a,CVar8);
        if (bVar2) {
          ::std::__cxx11::string::_M_assign((string *)local_218);
          break;
        }
        ::std::__cxx11::string::_M_assign((string *)local_2b8);
        CatalogTypeToString_abi_cxx11_(&local_2d8,(duckdb *)(ulong)CVar8,type);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   &local_2d8);
        ::std::__cxx11::string::~string((string *)&local_2d8);
      }
      pCVar14 = local_2e8;
      if (local_218._8_8_ == 0) {
        if (local_268._M_string_length - (long)local_268._M_dataplus._M_p == 0x20) {
          pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_268,0);
          ::std::__cxx11::string::string
                    ((string *)&local_2d8,
                     "%s with name \"%s\" is not in the catalog, a function by this name exists in the %s extension, but it\'s of a different type, namely %s"
                     ,(allocator *)&local_288);
          CatalogTypeToString_abi_cxx11_(&local_88,this_03,type_00);
          ::std::__cxx11::string::string((string *)&local_a8,(string *)pCVar14);
          ::std::__cxx11::string::string((string *)&local_c8,(string *)local_2b8);
          ::std::__cxx11::string::string((string *)&local_e8,(string *)pvVar5);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_2e0,&local_2d8,&local_88,&local_a8,&local_c8,&local_e8);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::__cxx11::string::~string((string *)&local_c8);
          ::std::__cxx11::string::~string((string *)&local_a8);
          this_01 = &local_88;
        }
        else {
          ::std::__cxx11::string::string((string *)&local_288,", ",(allocator *)local_1e0);
          StringUtil::Join(&local_2d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)&local_268,&local_288);
          ::std::__cxx11::string::~string((string *)&local_288);
          ::std::__cxx11::string::string
                    ((string *)&local_288,
                     "%s with name \"%s\" is not in the catalog, functions with this name exist in the %s extension, but they are of different types, namely %s"
                     ,(allocator *)local_1e0);
          CatalogTypeToString_abi_cxx11_(&local_108,this_03,type_01);
          ::std::__cxx11::string::string((string *)&local_128,(string *)pCVar14);
          ::std::__cxx11::string::string((string *)&local_148,(string *)local_2b8);
          ::std::__cxx11::string::string((string *)&local_168,(string *)&local_2d8);
          CatalogException::
          CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (local_2e0,&local_288,&local_108,&local_128,&local_148,&local_168);
          ::std::__cxx11::string::~string((string *)&local_168);
          ::std::__cxx11::string::~string((string *)&local_148);
          ::std::__cxx11::string::~string((string *)&local_128);
          ::std::__cxx11::string::~string((string *)&local_108);
          this_01 = &local_288;
        }
        ::std::__cxx11::string::~string((string *)this_01);
        ::std::__cxx11::string::~string((string *)&local_2d8);
        ::std::__cxx11::string::~string((string *)local_2b8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_268);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                   *)&local_248);
        goto LAB_00225861;
      }
      ::std::__cxx11::string::~string((string *)local_2b8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268);
      pCVar12 = local_2e8;
      pCVar14 = local_220;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
               *)&local_248);
    CVar8 = extraout_DL;
  }
  else {
    if (type_a == COLLATION_ENTRY) {
      ExtensionHelper::FindExtensionInEntries<130ul>
                ((string *)local_2b8,(ExtensionHelper *)pCVar12,(string *)&EXTENSION_COLLATIONS,
                 (ExtensionEntry (*) [130])schemas);
    }
    else if (type_a == COPY_FUNCTION_ENTRY) {
      ExtensionHelper::FindExtensionInEntries<2ul>
                ((string *)local_2b8,(ExtensionHelper *)pCVar12,(string *)"parquet",
                 (ExtensionEntry (*) [2])schemas);
    }
    else {
      if (type_a != TYPE_ENTRY) goto LAB_002251ac;
      ExtensionHelper::FindExtensionInEntries<3ul>
                ((string *)local_2b8,(ExtensionHelper *)pCVar12,(string *)&EXTENSION_TYPES,
                 (ExtensionEntry (*) [3])schemas);
    }
    ::std::__cxx11::string::operator=((string *)local_218,(string *)local_2b8);
    ::std::__cxx11::string::~string((string *)local_2b8);
    CVar8 = extraout_DL_00;
  }
LAB_002251ac:
  if (local_218._8_8_ != 0) {
    CatalogTypeToString_abi_cxx11_((string *)local_1e0,this_03,CVar8);
    ::std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     " with name \"");
    ::std::operator+(&local_248,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar12);
    ::std::operator+(&local_288,&local_248,"\" is not in the catalog, but it exists in the ");
    ::std::operator+(&local_2d8,&local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     &local_2d8," extension.");
    ::std::__cxx11::string::~string((string *)&local_2d8);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::string::~string((string *)local_1e0);
    ExtensionHelper::AddExtensionInstallHintToErrorMsg
              (&local_2d8,pCVar14,(string *)local_2b8,(string *)local_218);
    ::std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_2d8);
    ::std::__cxx11::string::~string((string *)&local_2d8);
    CatalogException::CatalogException(local_2e0,(string *)local_2b8);
    ::std::__cxx11::string::~string((string *)local_2b8);
    goto LAB_00225861;
  }
  SimilarEntriesInSchemas
            ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1f8,pCVar14,local_228,
             (reference_set_t<SchemaCatalogEntry> *)&local_68);
  local_2a8._8_8_ = &local_2b0;
  local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((ulong)local_2b0 & 0xffffffff00000000);
  local_2a8._M_allocated_capacity = 0;
  local_290 = 0;
  local_298 = (_Base_ptr)local_2a8._8_8_;
  if (local_1f8.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_1f8.
      super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_002256a7:
    if (local_1c0.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (pSVar11 = local_1c0.
                     super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pSVar11 !=
          local_1c0.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish; pSVar11 = pSVar11 + 1) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_2b8,&pSVar11->name);
      }
    }
  }
  else {
    pvVar4 = vector<duckdb::SimilarCatalogEntry,_true>::get<true>
                       ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1f8,0);
    if ((pvVar4->score != 1.0) || (NAN(pvVar4->score))) {
      pvVar4 = vector<duckdb::SimilarCatalogEntry,_true>::get<true>
                         ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1f8,0);
      local_2e8 = (ClientContext *)pvVar4->score;
      if (local_1c0.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1c0.
          super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        dVar15 = 0.0;
      }
      else {
        pvVar4 = vector<duckdb::SimilarCatalogEntry,_true>::get<true>
                           ((vector<duckdb::SimilarCatalogEntry,_true> *)&local_1c0,0);
        dVar15 = pvVar4->score;
      }
      if ((double)local_2e8 + -0.2 <= dVar15) goto LAB_002256a7;
    }
    for (pSVar11 = local_1f8.
                   super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar11 !=
        local_1f8.
        super__Vector_base<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish; pSVar11 = pSVar11 + 1) {
      pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&pSVar11->schema);
      ::std::__cxx11::string::string
                ((string *)&local_2d8,
                 (string *)&(((pSVar6->super_InCatalogEntry).catalog)->db->super_CatalogEntry).name)
      ;
      pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&pSVar11->schema);
      ::std::__cxx11::string::string
                ((string *)&local_288,
                 (string *)&(pSVar6->super_InCatalogEntry).super_CatalogEntry.name);
      FindMinimalQualification(local_1a8,&local_2d8,&local_288,(bool *)&local_268,local_1e0);
      SimilarCatalogEntry::GetQualifiedName_abi_cxx11_
                (&local_248,pSVar11,local_268._M_dataplus._M_p._0_1_,local_1e0[0]);
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_2b8,&local_248);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_288);
      ::std::__cxx11::string::~string((string *)&local_2d8);
    }
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  if (local_290 < 3) {
    ::std::__cxx11::string::string((string *)&local_248," or ",(allocator *)&local_268);
    StringUtil::Join(&local_288,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b8,&local_248);
    ::std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_288);
    this_02 = &local_248;
  }
  else {
    lVar7 = ::std::_Rb_tree_decrement((_Rb_tree_node_base *)&local_2b0);
    ::std::__cxx11::string::string((string *)&local_288,(string *)(lVar7 + 0x20));
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b8,&local_288);
    ::std::__cxx11::string::string((string *)&local_188,", ",&local_2e9);
    StringUtil::Join((string *)local_1e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b8,&local_188);
    ::std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     ", or ");
    ::std::operator+(&local_248,&local_268,&local_288);
    ::std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::string::~string((string *)local_1e0);
    ::std::__cxx11::string::~string((string *)&local_188);
    this_02 = &local_288;
  }
  ::std::__cxx11::string::~string((string *)this_02);
  CatalogException::MissingEntry(local_2e0,local_228,&local_2d8);
  ::std::__cxx11::string::~string((string *)&local_2d8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_1f8);
LAB_00225861:
  ::std::__cxx11::string::~string((string *)local_218);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::~_Vector_base(&local_1a0);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::~vector
            (&local_1c0);
  return local_2e0;
}

Assistant:

CatalogException Catalog::CreateMissingEntryException(CatalogEntryRetriever &retriever,
                                                      const EntryLookupInfo &lookup_info,
                                                      const reference_set_t<SchemaCatalogEntry> &schemas) {
	auto &context = retriever.GetContext();
	auto entries = SimilarEntriesInSchemas(context, lookup_info, schemas);

	reference_set_t<SchemaCatalogEntry> unseen_schemas;
	auto &db_manager = DatabaseManager::Get(context);
	auto databases = db_manager.GetDatabases(context);
	auto &config = DBConfig::GetConfig(context);

	auto max_schema_count = config.GetSetting<CatalogErrorMaxSchemasSetting>(context);
	for (auto database : databases) {
		if (unseen_schemas.size() >= max_schema_count) {
			break;
		}
		auto &catalog = database.get().GetCatalog();
		auto current_schemas = catalog.GetAllSchemas(context);
		for (auto &current_schema : current_schemas) {
			if (unseen_schemas.size() >= max_schema_count) {
				break;
			}
			unseen_schemas.insert(current_schema.get());
		}
	}
	// check if the entry exists in any extension
	string extension_name;
	auto type = lookup_info.GetCatalogType();
	auto &entry_name = lookup_info.GetEntryName();
	if (type == CatalogType::TABLE_FUNCTION_ENTRY || type == CatalogType::SCALAR_FUNCTION_ENTRY ||
	    type == CatalogType::AGGREGATE_FUNCTION_ENTRY || type == CatalogType::PRAGMA_FUNCTION_ENTRY) {
		auto lookup_result = ExtensionHelper::FindExtensionInFunctionEntries(entry_name, EXTENSION_FUNCTIONS);
		do {
			if (lookup_result.empty()) {
				break;
			}
			vector<string> other_types;
			string extension_for_error;
			for (auto &function : lookup_result) {
				auto function_type = function.second;
				if (CompareCatalogTypes(type, function_type)) {
					extension_name = function.first;
					break;
				}
				extension_for_error = function.first;
				other_types.push_back(CatalogTypeToString(function_type));
			}
			if (!extension_name.empty()) {
				break;
			}
			if (other_types.size() == 1) {
				auto &function_type = other_types[0];
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, a function by this name exists "
				                     "in the %s extension, but it's of a different type, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, function_type);
				return error;
			} else {
				D_ASSERT(!other_types.empty());
				auto list_of_types = StringUtil::Join(other_types, ", ");
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, functions with this name exist "
				                     "in the %s extension, but they are of different types, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, list_of_types);
				return error;
			}
		} while (false);
	} else if (type == CatalogType::TYPE_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_TYPES);
	} else if (type == CatalogType::COPY_FUNCTION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COPY_FUNCTIONS);
	} else if (type == CatalogType::COLLATION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COLLATIONS);
	}

	// if we found an extension that can handle this catalog entry, create an error hinting the user
	if (!extension_name.empty()) {
		auto error_message = CatalogTypeToString(type) + " with name \"" + entry_name +
		                     "\" is not in the catalog, but it exists in the " + extension_name + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(context, error_message, extension_name);
		return CatalogException(error_message);
	}

	// entries in other schemas get a penalty
	// however, if there is an exact match in another schema, we will always show it
	static constexpr const double UNSEEN_PENALTY = 0.2;
	auto unseen_entries = SimilarEntriesInSchemas(context, lookup_info, unseen_schemas);
	set<string> suggestions;
	if (!unseen_entries.empty() && (unseen_entries[0].score == 1.0 || unseen_entries[0].score - UNSEEN_PENALTY >
	                                                                      (entries.empty() ? 0.0 : entries[0].score))) {
		// the closest matching entry requires qualification as it is not in the default search path
		// check how to minimally qualify this entry
		for (auto &unseen_entry : unseen_entries) {
			auto catalog_name = unseen_entry.schema->catalog.GetName();
			auto schema_name = unseen_entry.schema->name;
			bool qualify_database;
			bool qualify_schema;
			FindMinimalQualification(retriever, catalog_name, schema_name, qualify_database, qualify_schema);
			auto qualified_name = unseen_entry.GetQualifiedName(qualify_database, qualify_schema);
			suggestions.insert(qualified_name);
		}
	} else if (!entries.empty()) {
		for (auto &entry : entries) {
			suggestions.insert(entry.name);
		}
	}

	string did_you_mean;
	if (suggestions.size() > 2) {
		string last = *suggestions.rbegin();
		suggestions.erase(last);
		did_you_mean = StringUtil::Join(suggestions, ", ") + ", or " + last;
	} else {
		did_you_mean = StringUtil::Join(suggestions, " or ");
	}

	return CatalogException::MissingEntry(lookup_info, did_you_mean);
}